

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

bool __thiscall cmCTestUpdateHandler::SelectVCS(cmCTestUpdateHandler *this)

{
  cmCTest *pcVar1;
  int iVar2;
  char *pcVar3;
  char *type;
  ulong uVar4;
  ostream *poVar5;
  string local_460 [32];
  string local_440 [32];
  undefined1 local_420 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_2a8 [8];
  ostringstream e;
  allocator local_129;
  string local_128;
  string local_108;
  char *local_e8;
  char *key;
  string local_d8;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  cmCTestUpdateHandler *local_18;
  cmCTestUpdateHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"UpdateCommand",&local_59);
  cmCTest::GetCTestConfiguration(&local_38,pcVar1,&local_58);
  std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"SourceDirectory",&local_91);
  pcVar3 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_90);
  iVar2 = DetectVCS(this,pcVar3);
  this->UpdateType = iVar2;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (this->UpdateType == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"UpdateType",(allocator *)((long)&key + 7));
    cmCTest::GetCTestConfiguration(&local_b8,pcVar1,&local_d8);
    type = (char *)std::__cxx11::string::c_str();
    iVar2 = DetermineType(this,pcVar3,type);
    this->UpdateType = iVar2;
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&key + 7));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    local_e8 = (char *)0x0;
    switch(this->UpdateType) {
    case 1:
      local_e8 = "CVSCommand";
      break;
    case 2:
      local_e8 = "SVNCommand";
      break;
    case 3:
      local_e8 = "BZRCommand";
      break;
    case 4:
      local_e8 = "GITCommand";
      break;
    case 5:
      local_e8 = "HGCommand";
      break;
    case 6:
      local_e8 = "P4Command";
    }
    pcVar3 = local_e8;
    if (local_e8 != (char *)0x0) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,pcVar3,&local_129);
      cmCTest::GetCTestConfiguration(&local_108,pcVar1,&local_128);
      std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      std::operator<<((ostream *)local_2a8,"Cannot find UpdateCommand ");
      if (local_e8 != (char *)0x0) {
        poVar5 = std::operator<<((ostream *)local_2a8,"or ");
        std::operator<<(poVar5,local_e8);
      }
      std::operator<<((ostream *)local_2a8," configuration key.");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
      std::__cxx11::ostringstream::str();
      poVar5 = std::operator<<((ostream *)local_420,local_440);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_440);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x159,pcVar3,false);
      std::__cxx11::string::~string(local_460);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
      goto LAB_005ef438;
    }
  }
  this_local._7_1_ = 1;
LAB_005ef438:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestUpdateHandler::SelectVCS()
{
  // Get update command
  this->UpdateCommand = this->CTest->GetCTestConfiguration("UpdateCommand");

  // Detect the VCS managing the source tree.
  this->UpdateType = this->DetectVCS(this->GetOption("SourceDirectory"));
  if (this->UpdateType == e_UNKNOWN) {
    // The source tree does not have a recognized VCS.  Check the
    // configuration value or command name.
    this->UpdateType = this->DetermineType(
      this->UpdateCommand.c_str(),
      this->CTest->GetCTestConfiguration("UpdateType").c_str());
  }

  // If no update command was specified, lookup one for this VCS tool.
  if (this->UpdateCommand.empty()) {
    const char* key = CM_NULLPTR;
    switch (this->UpdateType) {
      case e_CVS:
        key = "CVSCommand";
        break;
      case e_SVN:
        key = "SVNCommand";
        break;
      case e_BZR:
        key = "BZRCommand";
        break;
      case e_GIT:
        key = "GITCommand";
        break;
      case e_HG:
        key = "HGCommand";
        break;
      case e_P4:
        key = "P4Command";
        break;
      default:
        break;
    }
    if (key) {
      this->UpdateCommand = this->CTest->GetCTestConfiguration(key);
    }
    if (this->UpdateCommand.empty()) {
      std::ostringstream e;
      e << "Cannot find UpdateCommand ";
      if (key) {
        e << "or " << key;
      }
      e << " configuration key.";
      cmCTestLog(this->CTest, ERROR_MESSAGE, e.str() << std::endl);
      return false;
    }
  }

  return true;
}